

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

void roaring64_bitmap_free(roaring64_bitmap_t *r)

{
  art_val_t *__ptr;
  leaf_t *leaf;
  art_iterator_t it;
  art_iterator_t local_a0;
  
  art_init_iterator(&local_a0,&r->art,true);
  if (local_a0.value != (art_val_t *)0x0) {
    do {
      __ptr = local_a0.value;
      container_free(*(container_t **)(local_a0.value[1].key + 2),local_a0.value[1].key[0]);
      roaring_free(__ptr);
      art_iterator_next(&local_a0);
    } while (local_a0.value != (art_val_t *)0x0);
  }
  art_free(&r->art);
  roaring_free(r);
  return;
}

Assistant:

void roaring64_bitmap_free(roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        container_free(leaf->container, leaf->typecode);
        free_leaf(leaf);
        art_iterator_next(&it);
    }
    art_free(&r->art);
    roaring_free(r);
}